

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

bool __thiscall glslang::HlslGrammar::acceptPostDecls(HlslGrammar *this,TQualifier *qualifier)

{
  HlslParseContext *this_00;
  TSourceLoc loc;
  anon_union_8_5_54ae9b2d_for_HlslToken_2 aVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  TBuiltInVariable builtIn;
  size_type sVar5;
  reference pvVar6;
  iterator __first;
  iterator __last;
  iterator __result;
  char *upperCase;
  undefined1 local_148 [8];
  TString semanticUpperCase;
  HlslToken spaceDesc;
  undefined1 local_f0 [4];
  int subComponent;
  HlslToken profile;
  HlslToken registerDesc;
  HlslToken componentToken;
  HlslToken locationToken;
  HlslToken idToken;
  bool found;
  TQualifier *qualifier_local;
  HlslGrammar *this_local;
  
  bVar3 = false;
  do {
    bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokColon);
    if (bVar2) {
      HlslToken::HlslToken((HlslToken *)&locationToken.field_2);
      bVar3 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokLayout);
      if (bVar3) {
        acceptLayoutQualifierList(this,qualifier);
      }
      else {
        bVar3 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokPackOffset);
        if (bVar3) {
          bVar3 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftParen);
          if (!bVar3) {
            expected(this,"(");
            return false;
          }
          HlslToken::HlslToken((HlslToken *)&componentToken.field_2);
          bVar3 = acceptIdentifier(this,(HlslToken *)&componentToken.field_2);
          if (!bVar3) {
            expected(this,"c[subcomponent][.component]");
            return false;
          }
          HlslToken::HlslToken((HlslToken *)&registerDesc.field_2);
          bVar3 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokDot);
          if ((bVar3) && (bVar3 = acceptIdentifier(this,(HlslToken *)&registerDesc.field_2), !bVar3)
             ) {
            expected(this,"component");
            return false;
          }
          bVar3 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightParen);
          if (!bVar3) {
            expected(this,")");
            return true;
          }
          HlslParseContext::handlePackOffset
                    (this->parseContext,(TSourceLoc *)&componentToken.field_2,qualifier,
                     (TString *)locationToken._24_8_,(TString *)componentToken._24_8_);
        }
        else {
          bVar3 = acceptIdentifier(this,(HlslToken *)&locationToken.field_2);
          if (!bVar3) {
            expected(this,"layout, semantic, packoffset, or register");
            return false;
          }
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                   *)idToken._24_8_,"register");
          if (bVar3) {
            bVar3 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftParen);
            if (!bVar3) {
              expected(this,"(");
              return false;
            }
            HlslToken::HlslToken((HlslToken *)&profile.field_2);
            HlslToken::HlslToken((HlslToken *)local_f0);
            bVar3 = acceptIdentifier(this,(HlslToken *)&profile.field_2);
            if (!bVar3) {
              expected(this,"register number description");
              return false;
            }
            sVar5 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::size
                              ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                *)registerDesc._24_8_);
            if (1 < sVar5) {
              pvVar6 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                       operator[]((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                   *)registerDesc._24_8_,1);
              iVar4 = isdigit((int)*pvVar6);
              if ((iVar4 == 0) &&
                 (bVar3 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokComma)
                 , bVar3)) {
                memcpy(local_f0,&profile.field_2,0x28);
                bVar3 = acceptIdentifier(this,(HlslToken *)&profile.field_2);
                if (!bVar3) {
                  expected(this,"register number description");
                  return false;
                }
              }
            }
            spaceDesc.field_2._4_4_ = 0;
            bVar3 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftBracket)
            ;
            if (bVar3) {
              bVar3 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokIntConstant)
              ;
              if (!bVar3) {
                expected(this,"literal integer");
                return false;
              }
              spaceDesc.field_2._4_4_ = (this->super_HlslTokenStream).token.field_2.i;
              HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
              bVar3 = HlslTokenStream::acceptTokenClass
                                (&this->super_HlslTokenStream,EHTokRightBracket);
              if (!bVar3) {
                expected(this,"]");
                return true;
              }
            }
            HlslToken::HlslToken((HlslToken *)((long)&semanticUpperCase.field_2 + 8));
            bVar3 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokComma);
            if ((bVar3) &&
               (bVar3 = acceptIdentifier(this,(HlslToken *)((long)&semanticUpperCase.field_2 + 8)),
               !bVar3)) {
              expected(this,"space identifier");
              return false;
            }
            bVar3 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightParen);
            if (!bVar3) {
              expected(this,")");
              return true;
            }
            HlslParseContext::handleRegister
                      (this->parseContext,(TSourceLoc *)&profile.field_2,qualifier,
                       (TString *)profile._24_8_,(TString *)registerDesc._24_8_,
                       spaceDesc.field_2._4_4_,(TString *)spaceDesc._24_8_);
          }
          else {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            *)local_148,
                           (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            *)idToken._24_8_);
            __first = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      begin((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)local_148);
            __last = std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::end
                               ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                 *)local_148);
            __result = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                       begin((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                              *)local_148);
            std::
            transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,int(*)(int)noexcept>
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>
                        )__first._M_current,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>
                        )__last._M_current,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>
                        )__result._M_current,toupper);
            aVar1 = locationToken.field_2;
            this_00 = this->parseContext;
            upperCase = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                        c_str((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                               *)local_148);
            builtIn = HlslTokenStream::mapSemantic(&this->super_HlslTokenStream,upperCase);
            loc._8_8_ = idToken.loc.name;
            loc.name = aVar1.string;
            loc._16_8_ = idToken.loc._8_8_;
            HlslParseContext::handleSemantic(this_00,loc,qualifier,builtIn,(TString *)local_148);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)local_148);
          }
        }
      }
    }
    else {
      bVar2 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokLeftAngle);
      if (!bVar2) {
        return bVar3;
      }
      acceptAnnotations(this,qualifier);
    }
    bVar3 = true;
  } while( true );
}

Assistant:

bool HlslGrammar::acceptPostDecls(TQualifier& qualifier)
{
    bool found = false;

    do {
        // COLON
        if (acceptTokenClass(EHTokColon)) {
            found = true;
            HlslToken idToken;
            if (peekTokenClass(EHTokLayout))
                acceptLayoutQualifierList(qualifier);
            else if (acceptTokenClass(EHTokPackOffset)) {
                // PACKOFFSET LEFT_PAREN c[Subcomponent][.component] RIGHT_PAREN
                if (! acceptTokenClass(EHTokLeftParen)) {
                    expected("(");
                    return false;
                }
                HlslToken locationToken;
                if (! acceptIdentifier(locationToken)) {
                    expected("c[subcomponent][.component]");
                    return false;
                }
                HlslToken componentToken;
                if (acceptTokenClass(EHTokDot)) {
                    if (! acceptIdentifier(componentToken)) {
                        expected("component");
                        return false;
                    }
                }
                if (! acceptTokenClass(EHTokRightParen)) {
                    expected(")");
                    break;
                }
                parseContext.handlePackOffset(locationToken.loc, qualifier, *locationToken.string, componentToken.string);
            } else if (! acceptIdentifier(idToken)) {
                expected("layout, semantic, packoffset, or register");
                return false;
            } else if (*idToken.string == "register") {
                // REGISTER LEFT_PAREN [shader_profile,] Type#[subcomp]opt (COMMA SPACEN)opt RIGHT_PAREN
                // LEFT_PAREN
                if (! acceptTokenClass(EHTokLeftParen)) {
                    expected("(");
                    return false;
                }
                HlslToken registerDesc;  // for Type#
                HlslToken profile;
                if (! acceptIdentifier(registerDesc)) {
                    expected("register number description");
                    return false;
                }
                if (registerDesc.string->size() > 1 && !isdigit((*registerDesc.string)[1]) &&
                                                       acceptTokenClass(EHTokComma)) {
                    // Then we didn't really see the registerDesc yet, it was
                    // actually the profile.  Adjust...
                    profile = registerDesc;
                    if (! acceptIdentifier(registerDesc)) {
                        expected("register number description");
                        return false;
                    }
                }
                int subComponent = 0;
                if (acceptTokenClass(EHTokLeftBracket)) {
                    // LEFT_BRACKET subcomponent RIGHT_BRACKET
                    if (! peekTokenClass(EHTokIntConstant)) {
                        expected("literal integer");
                        return false;
                    }
                    subComponent = token.i;
                    advanceToken();
                    if (! acceptTokenClass(EHTokRightBracket)) {
                        expected("]");
                        break;
                    }
                }
                // (COMMA SPACEN)opt
                HlslToken spaceDesc;
                if (acceptTokenClass(EHTokComma)) {
                    if (! acceptIdentifier(spaceDesc)) {
                        expected ("space identifier");
                        return false;
                    }
                }
                // RIGHT_PAREN
                if (! acceptTokenClass(EHTokRightParen)) {
                    expected(")");
                    break;
                }
                parseContext.handleRegister(registerDesc.loc, qualifier, profile.string, *registerDesc.string, subComponent, spaceDesc.string);
            } else {
                // semantic, in idToken.string
                TString semanticUpperCase = *idToken.string;
                std::transform(semanticUpperCase.begin(), semanticUpperCase.end(), semanticUpperCase.begin(), ::toupper);
                parseContext.handleSemantic(idToken.loc, qualifier, mapSemantic(semanticUpperCase.c_str()), semanticUpperCase);
            }
        } else if (peekTokenClass(EHTokLeftAngle)) {
            found = true;
            acceptAnnotations(qualifier);
        } else
            break;

    } while (true);

    return found;
}